

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O3

void __thiscall
capnp::TwoPartyServer::AcceptedConnection::AcceptedConnection
          (AcceptedConnection *this,Client *bootstrapInterface,
          Own<kj::AsyncIoStream> *connectionParam)

{
  AsyncIoStream *pAVar1;
  ClientHook *pCVar2;
  RpcSystem<capnp::rpc::twoparty::VatId> RVar3;
  ReaderOptions receiveOptions;
  Client local_28;
  
  pAVar1 = connectionParam->ptr;
  (this->connection).disposer = connectionParam->disposer;
  (this->connection).ptr = pAVar1;
  connectionParam->ptr = (AsyncIoStream *)0x0;
  receiveOptions._8_8_ = 0x40;
  receiveOptions.traversalLimitInWords = 0x800000;
  TwoPartyVatNetwork::TwoPartyVatNetwork
            (&this->network,(this->connection).ptr,SERVER,receiveOptions);
  local_28.hook.disposer = (bootstrapInterface->hook).disposer;
  local_28.hook.ptr = (bootstrapInterface->hook).ptr;
  (bootstrapInterface->hook).ptr = (ClientHook *)0x0;
  RVar3 = makeRpcServer<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
                    ((capnp *)&this->rpcSystem,&(this->network).super_TwoPartyVatNetworkBase,
                     &local_28);
  pCVar2 = local_28.hook.ptr;
  if (local_28.hook.ptr != (ClientHook *)0x0) {
    local_28.hook.ptr = (ClientHook *)0x0;
    (**(local_28.hook.disposer)->_vptr_Disposer)
              (local_28.hook.disposer,pCVar2->_vptr_ClientHook[-2] + (long)&pCVar2->_vptr_ClientHook
               ,RVar3.super_RpcSystemBase.impl.ptr);
  }
  return;
}

Assistant:

explicit AcceptedConnection(Capability::Client bootstrapInterface,
                              kj::Own<kj::AsyncIoStream>&& connectionParam)
      : connection(kj::mv(connectionParam)),
        network(*connection, rpc::twoparty::Side::SERVER),
        rpcSystem(makeRpcServer(network, kj::mv(bootstrapInterface))) {}